

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argparse_fasta_diff.cpp
# Opt level: O0

void __thiscall argparse::args_t::parse_file_operation(args_t *this,char *str)

{
  int iVar1;
  char *in_RSI;
  long in_RDI;
  
  iVar1 = strcmp(in_RSI,"add");
  if (iVar1 == 0) {
    *(undefined4 *)(in_RDI + 0x18) = 0;
  }
  else {
    iVar1 = strcmp(in_RSI,"replace");
    if (iVar1 == 0) {
      *(undefined4 *)(in_RDI + 0x18) = 1;
    }
    else {
      iVar1 = strcmp(in_RSI,"remove");
      if (iVar1 == 0) {
        *(undefined4 *)(in_RDI + 0x18) = 2;
      }
      else {
        ERROR("invalid file operation: %s",in_RSI);
      }
    }
  }
  return;
}

Assistant:

void args_t::parse_file_operation( const char * str )
    {
        if (!strcmp (str, "add")) {
            op = add;
        } else if (!strcmp (str, "replace")) {
            op = replace;
        } else if (!strcmp (str, "remove")) {
            op = remove;
        } else  {
            ERROR( "invalid file operation: %s", str );
        }
    }